

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_pack_data
              (nghttp2_session *session,nghttp2_bufs *bufs,size_t datamax,nghttp2_frame *frame,
              nghttp2_data_aux_data *aux_data,nghttp2_stream *stream)

{
  nghttp2_bufs *bufs_00;
  uint32_t uVar1;
  uint8_t *puVar2;
  nghttp2_data_aux_data *pnVar3;
  nghttp2_stream *stream_00;
  int iVar4;
  uint uVar5;
  nghttp2_data_source_read_length_callback2 p_Var6;
  nghttp2_ssize nVar7;
  ulong uVar8;
  size_t sVar9;
  uint32_t uVar10;
  nghttp2_pq *pq;
  ulong uVar11;
  size_t sVar12;
  nghttp2_buf_chain *pnVar13;
  uint32_t data_flags;
  uint32_t local_4c;
  nghttp2_bufs *local_48;
  nghttp2_data_aux_data *local_40;
  nghttp2_stream *local_38;
  
  pnVar13 = bufs->cur;
  local_40 = aux_data;
  if (bufs->head != pnVar13) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1e0c,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  p_Var6 = (session->callbacks).read_length_callback2;
  local_48 = bufs;
  local_38 = stream;
  if ((p_Var6 != (nghttp2_data_source_read_length_callback2)0x0) ||
     (p_Var6 = (nghttp2_data_source_read_length_callback2)(session->callbacks).read_length_callback,
     sVar12 = datamax, p_Var6 != (nghttp2_data_source_read_length_callback2)0x0)) {
    nVar7 = (*p_Var6)(session,(frame->hd).type,stream->stream_id,session->remote_window_size,
                      stream->remote_window_size,(session->remote_settings).max_frame_size,
                      session->user_data);
    uVar10 = stream->remote_window_size;
    if ((int)(uint32_t)nVar7 < stream->remote_window_size) {
      uVar10 = (uint32_t)nVar7;
    }
    uVar1 = (session->remote_settings).max_frame_size;
    if (session->remote_window_size <= (int)uVar10) {
      uVar10 = session->remote_window_size;
    }
    if ((int)uVar1 <= (int)uVar10) {
      uVar10 = uVar1;
    }
    if ((int)uVar10 < 1) {
      uVar11 = 0xfffffc7a;
      goto LAB_0010ff85;
    }
    uVar11 = (ulong)(int)uVar10;
    sVar12 = uVar11;
    if ((ulong)((long)(pnVar13->buf).end - (long)(pnVar13->buf).last) < uVar11) {
      bufs_00 = &(session->aob).framebufs;
      iVar4 = nghttp2_bufs_realloc(bufs_00,uVar11 + 10);
      sVar12 = datamax;
      if (iVar4 == 0) {
        if (bufs_00 != local_48) {
          __assert_fail("&session->aob.framebufs == bufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0x1e37,
                        "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                       );
        }
        pnVar13 = local_48->cur;
        sVar12 = uVar11;
      }
    }
  }
  pnVar3 = local_40;
  if ((ulong)((long)(pnVar13->buf).end - (long)(pnVar13->buf).last) < sVar12) {
    __assert_fail("nghttp2_buf_avail(buf) >= datamax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1e40,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  local_4c = 0;
  if (1 < (local_40->dpw).version - 1U) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1e51,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  uVar8 = (*(local_40->dpw).data_prd.v1.read_callback)
                    (session,(frame->hd).stream_id,(pnVar13->buf).pos,sVar12,&local_4c,
                     (nghttp2_data_source *)&(local_40->dpw).data_prd,session->user_data);
  stream_00 = local_38;
  if ((uVar8 + 0x20e < 0x13) && ((0x40021UL >> (uVar8 + 0x20e & 0x3f) & 1) != 0)) {
    uVar11 = uVar8 & 0xffffffff;
  }
  else {
    uVar11 = 0xfffffc7a;
    if ((-1 < (long)uVar8) && (uVar8 <= sVar12)) {
      puVar2 = (pnVar13->buf).pos;
      (pnVar13->buf).last = puVar2 + uVar8;
      (pnVar13->buf).pos = puVar2 + -9;
      (frame->hd).flags = '\0';
      if ((((local_4c & 1) != 0) && (pnVar3->eof = '\x01', (local_4c & 2) == 0)) &&
         ((pnVar3->flags & 1) != 0)) {
        (frame->hd).flags = (frame->hd).flags | 1;
      }
      if ((local_4c & 4) != 0) {
        if ((session->callbacks).send_data_callback == (nghttp2_send_data_callback)0x0)
        goto LAB_0010ff85;
        local_40->no_copy = '\x01';
      }
      (frame->hd).length = uVar8;
      (frame->data).padlen = 0;
      uVar11 = uVar8 + 0x100;
      if (sVar12 < uVar8 + 0x100) {
        uVar11 = sVar12;
      }
      uVar11 = session_call_select_padding(session,frame,uVar11);
      if (-0x385 < (int)uVar11) {
        (frame->ext).payload = (void *)(uVar11 - uVar8);
        nghttp2_frame_pack_frame_hd((pnVar13->buf).pos,&frame->hd);
        nghttp2_frame_add_pad(local_48,&frame->hd,(frame->data).padlen,(uint)local_40->no_copy);
        sVar12 = (stream_00->item->frame).hd.length;
        stream_00->last_writelen = sVar12;
        if ((stream_00->flags & 0x10) == 0) {
          nghttp2_stream_reschedule(stream_00);
        }
        else if (session->server != '\0') {
          uVar5 = stream_00->extpri & 0x7f;
          if (7 < (byte)uVar5) {
            __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                          ,0x432,
                          "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)"
                         );
          }
          if ((char)stream_00->extpri < '\0') {
            pq = &session->sched[uVar5].ob_data;
            sVar9 = nghttp2_pq_size(pq);
            if (sVar9 != 1) {
              nghttp2_pq_remove(pq,&stream_00->pq_entry);
              stream_00->cycle = stream_00->cycle + sVar12;
              iVar4 = nghttp2_pq_push(pq,&stream_00->pq_entry);
              if (iVar4 != 0) {
                __assert_fail("0 == rv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                              ,0x440,
                              "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)"
                             );
              }
            }
          }
        }
        if (((frame->hd).length != 0) || (uVar11 = 0xfffffde9, (~local_4c & 3) != 0)) {
          uVar11 = 0;
        }
      }
    }
  }
LAB_0010ff85:
  return (int)uVar11;
}

Assistant:

int nghttp2_session_pack_data(nghttp2_session *session, nghttp2_bufs *bufs,
                              size_t datamax, nghttp2_frame *frame,
                              nghttp2_data_aux_data *aux_data,
                              nghttp2_stream *stream) {
  int rv;
  uint32_t data_flags;
  nghttp2_ssize payloadlen;
  nghttp2_ssize padded_payloadlen;
  nghttp2_buf *buf;
  size_t max_payloadlen;

  assert(bufs->head == bufs->cur);

  buf = &bufs->cur->buf;

  if (session->callbacks.read_length_callback2 ||
      session->callbacks.read_length_callback) {
    if (session->callbacks.read_length_callback2) {
      payloadlen = session->callbacks.read_length_callback2(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);
    } else {
      payloadlen = (nghttp2_ssize)session->callbacks.read_length_callback(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);
    }

    DEBUGF("send: read_length_callback=%td\n", payloadlen);

    payloadlen =
      nghttp2_session_enforce_flow_control_limits(session, stream, payloadlen);

    DEBUGF("send: read_length_callback after flow control=%td\n", payloadlen);

    if (payloadlen <= 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }

    if ((size_t)payloadlen > nghttp2_buf_avail(buf)) {
      /* Resize the current buffer(s).  The reason why we do +1 for
         buffer size is for possible padding field. */
      rv = nghttp2_bufs_realloc(&session->aob.framebufs,
                                (size_t)(NGHTTP2_FRAME_HDLEN + 1 + payloadlen));

      if (rv != 0) {
        DEBUGF("send: realloc buffer failed rv=%d", rv);
        /* If reallocation failed, old buffers are still in tact.  So
           use safe limit. */
        payloadlen = (nghttp2_ssize)datamax;

        DEBUGF("send: use safe limit payloadlen=%td", payloadlen);
      } else {
        assert(&session->aob.framebufs == bufs);

        buf = &bufs->cur->buf;
      }
    }
    datamax = (size_t)payloadlen;
  }

  /* Current max DATA length is less then buffer chunk size */
  assert(nghttp2_buf_avail(buf) >= datamax);

  data_flags = NGHTTP2_DATA_FLAG_NONE;
  switch (aux_data->dpw.version) {
  case NGHTTP2_DATA_PROVIDER_V1:
    payloadlen = (nghttp2_ssize)aux_data->dpw.data_prd.v1.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->dpw.data_prd.source, session->user_data);

    break;
  case NGHTTP2_DATA_PROVIDER_V2:
    payloadlen = aux_data->dpw.data_prd.v2.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->dpw.data_prd.source, session->user_data);

    break;
  default:
    assert(0);
    abort();
  }

  if (payloadlen == NGHTTP2_ERR_DEFERRED ||
      payloadlen == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE ||
      payloadlen == NGHTTP2_ERR_PAUSE) {
    DEBUGF("send: DATA postponed due to %s\n",
           nghttp2_strerror((int)payloadlen));

    return (int)payloadlen;
  }

  if (payloadlen < 0 || datamax < (size_t)payloadlen) {
    /* This is the error code when callback is failed. */
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  buf->last = buf->pos + payloadlen;
  buf->pos -= NGHTTP2_FRAME_HDLEN;

  /* Clear flags, because this may contain previous flags of previous
     DATA */
  frame->hd.flags = NGHTTP2_FLAG_NONE;

  if (data_flags & NGHTTP2_DATA_FLAG_EOF) {
    aux_data->eof = 1;
    /* If NGHTTP2_DATA_FLAG_NO_END_STREAM is set, don't set
       NGHTTP2_FLAG_END_STREAM */
    if ((aux_data->flags & NGHTTP2_FLAG_END_STREAM) &&
        (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM) == 0) {
      frame->hd.flags |= NGHTTP2_FLAG_END_STREAM;
    }
  }

  if (data_flags & NGHTTP2_DATA_FLAG_NO_COPY) {
    if (session->callbacks.send_data_callback == NULL) {
      DEBUGF("NGHTTP2_DATA_FLAG_NO_COPY requires send_data_callback set\n");

      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    aux_data->no_copy = 1;
  }

  frame->hd.length = (size_t)payloadlen;
  frame->data.padlen = 0;

  max_payloadlen =
    nghttp2_min_size(datamax, frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
    session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  frame->data.padlen = (size_t)(padded_payloadlen - payloadlen);

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_frame_add_pad(bufs, &frame->hd, frame->data.padlen,
                        aux_data->no_copy);

  session_reschedule_stream(session, stream);

  if (frame->hd.length == 0 && (data_flags & NGHTTP2_DATA_FLAG_EOF) &&
      (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM)) {
    /* DATA payload length is 0, and DATA frame does not bear
       END_STREAM.  In this case, there is no point to send 0 length
       DATA frame. */
    return NGHTTP2_ERR_CANCEL;
  }

  return 0;
}